

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_adaptive_eval.h
# Opt level: O1

void __thiscall
embree::sse2::FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
          (FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *this,
          CatmullClarkPatch *patch,Vec2f *uv,float dscale,size_t depth,BezierCurve *border0,
          BezierCurve *border1,BezierCurve *border2,BezierCurve *border3)

{
  undefined8 *puVar1;
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *pDVar2;
  uint uVar3;
  undefined1 *puVar4;
  vfloat_impl<4> *pvVar5;
  vfloat_impl<4> *pvVar6;
  vfloat_impl<4> *pvVar7;
  vfloat_impl<4> *pvVar8;
  vfloat_impl<4> *pvVar9;
  vfloat_impl<4> *pvVar10;
  anon_union_8_2_4062524c_for_Vec2<float>_1 aVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 uVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  anon_struct_8_2_947311e6_for_anon_union_8_2_4062524c_for_Vec2<float>_1_0 aVar29;
  ulong uVar30;
  long *plVar31;
  long lVar32;
  long lVar33;
  undefined1 *puVar34;
  ulong uVar35;
  long *plVar36;
  int iVar37;
  BezierCurve *pBVar38;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar39;
  undefined1 *puVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar58;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar59;
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float t0;
  float fVar71;
  undefined1 auVar72 [16];
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar85 [16];
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL> patches;
  float local_3540;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3480;
  float local_3470;
  float fStack_346c;
  float fStack_3468;
  float fStack_3464;
  float local_3460;
  float fStack_345c;
  float fStack_3458;
  float fStack_3454;
  float local_3450;
  float fStack_344c;
  float fStack_3448;
  float fStack_3444;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3440;
  float local_3430;
  float fStack_342c;
  float fStack_3428;
  float fStack_3424;
  float local_3420;
  float fStack_341c;
  float fStack_3418;
  float fStack_3414;
  float local_3410;
  float fStack_340c;
  float fStack_3408;
  float fStack_3404;
  float local_3400;
  float fStack_33fc;
  float fStack_33f8;
  float fStack_33f4;
  float local_33f0;
  float fStack_33ec;
  float fStack_33e8;
  float fStack_33e4;
  float local_33e0;
  float fStack_33dc;
  float fStack_33d8;
  float fStack_33d4;
  float local_33d0;
  float fStack_33cc;
  float fStack_33c8;
  float fStack_33c4;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_33c0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_33b0;
  float local_33a0;
  float fStack_339c;
  float fStack_3398;
  float fStack_3394;
  float local_3390;
  float fStack_338c;
  float fStack_3388;
  float fStack_3384;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3380;
  float local_3370;
  float fStack_336c;
  float fStack_3368;
  float fStack_3364;
  float local_3360;
  float fStack_335c;
  float fStack_3358;
  float fStack_3354;
  float local_3350;
  float fStack_334c;
  float fStack_3348;
  float fStack_3344;
  long local_3180 [320];
  undefined8 local_2780 [8];
  DynamicStackArray<float,_16UL,_64UL> DStack_2740;
  undefined8 local_26c0 [8];
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> aDStack_2680 [5];
  undefined8 local_1a80 [8];
  DynamicStackArray<float,_16UL,_64UL> DStack_1a40;
  undefined8 local_19c0 [8];
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> aDStack_1980 [5];
  undefined8 local_d80 [8];
  DynamicStackArray<float,_16UL,_64UL> DStack_d40;
  undefined8 local_cc0 [8];
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> aDStack_c80 [4];
  undefined1 local_380 [768];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_80 [5];
  
  local_3540 = dscale;
  do {
    uVar3 = (patch->ring).items[0].face_valence;
    if ((ulong)uVar3 == 0) {
      uVar30 = 0;
    }
    else {
      uVar35 = 0;
      uVar30 = 0;
      do {
        uVar30 = uVar30 + (0.0 < (patch->ring).items[0].crease_weight.data[uVar35]);
        uVar35 = uVar35 + 1;
      } while (uVar3 != uVar35);
    }
    iVar37 = (patch->ring).items[0].border_index;
    bVar41 = uVar30 == (uint)(iVar37 != -1) * 2;
    bVar25 = true;
    bVar24 = bVar41;
    bVar28 = bVar25;
    if (uVar3 == 2 && iVar37 != -1) {
      fVar45 = (patch->ring).items[0].vertex_crease_weight;
      if (((fVar45 != 0.0) || (NAN(fVar45))) && (fVar45 < INFINITY)) {
        bVar24 = false;
        bVar28 = false;
      }
    }
    else {
      fVar45 = (patch->ring).items[0].vertex_crease_weight;
      bVar24 = false;
      bVar28 = false;
      if (((fVar45 == 0.0) && (!NAN(fVar45))) &&
         (bVar24 = bVar41, bVar28 = bVar25, uVar3 != 3 || iVar37 == -1)) {
        bVar24 = (uVar3 == 4 && iVar37 == -1) && bVar41;
        bVar28 = uVar3 == 4 && iVar37 == -1;
      }
    }
    uVar3 = (patch->ring).items[1].face_valence;
    if ((ulong)uVar3 == 0) {
      uVar30 = 0;
    }
    else {
      uVar35 = 0;
      uVar30 = 0;
      do {
        uVar30 = uVar30 + (0.0 < (patch->ring).items[1].crease_weight.data[uVar35]);
        uVar35 = uVar35 + 1;
      } while (uVar3 != uVar35);
    }
    iVar37 = (patch->ring).items[1].border_index;
    bVar42 = uVar30 == (uint)(iVar37 != -1) * 2;
    bVar23 = true;
    bVar25 = bVar42;
    bVar41 = bVar23;
    if (uVar3 == 2 && iVar37 != -1) {
      fVar45 = (patch->ring).items[1].vertex_crease_weight;
      if (((fVar45 != 0.0) || (NAN(fVar45))) && (fVar45 < INFINITY)) {
        bVar25 = false;
        bVar41 = false;
      }
    }
    else {
      fVar45 = (patch->ring).items[1].vertex_crease_weight;
      bVar25 = false;
      bVar41 = false;
      if (((fVar45 == 0.0) && (!NAN(fVar45))) &&
         (bVar25 = bVar42, bVar41 = bVar23, uVar3 != 3 || iVar37 == -1)) {
        bVar25 = (uVar3 == 4 && iVar37 == -1) && bVar42;
        bVar41 = uVar3 == 4 && iVar37 == -1;
      }
    }
    uVar3 = (patch->ring).items[2].face_valence;
    if ((ulong)uVar3 == 0) {
      uVar30 = 0;
    }
    else {
      uVar35 = 0;
      uVar30 = 0;
      do {
        uVar30 = uVar30 + (0.0 < (patch->ring).items[2].crease_weight.data[uVar35]);
        uVar35 = uVar35 + 1;
      } while (uVar3 != uVar35);
    }
    iVar37 = (patch->ring).items[2].border_index;
    bVar43 = uVar30 == (uint)(iVar37 != -1) * 2;
    bVar42 = true;
    bVar23 = bVar43;
    bVar27 = bVar42;
    if (uVar3 == 2 && iVar37 != -1) {
      fVar45 = (patch->ring).items[2].vertex_crease_weight;
      if (((fVar45 != 0.0) || (NAN(fVar45))) && (fVar45 < INFINITY)) {
        bVar23 = false;
        bVar27 = false;
      }
    }
    else {
      fVar45 = (patch->ring).items[2].vertex_crease_weight;
      bVar23 = false;
      bVar27 = false;
      if (((fVar45 == 0.0) && (!NAN(fVar45))) &&
         (bVar23 = bVar43, bVar27 = bVar42, uVar3 != 3 || iVar37 == -1)) {
        bVar23 = (uVar3 == 4 && iVar37 == -1) && bVar43;
        bVar27 = uVar3 == 4 && iVar37 == -1;
      }
    }
    uVar3 = (patch->ring).items[3].face_valence;
    if ((ulong)uVar3 == 0) {
      uVar30 = 0;
    }
    else {
      uVar35 = 0;
      uVar30 = 0;
      do {
        uVar30 = uVar30 + (0.0 < (patch->ring).items[3].crease_weight.data[uVar35]);
        uVar35 = uVar35 + 1;
      } while (uVar3 != uVar35);
    }
    iVar37 = (patch->ring).items[3].border_index;
    bVar44 = uVar30 == (uint)(iVar37 != -1) * 2;
    bVar26 = true;
    bVar42 = bVar44;
    bVar43 = bVar26;
    if (uVar3 == 2 && iVar37 != -1) {
      fVar45 = (patch->ring).items[3].vertex_crease_weight;
      if (((fVar45 != 0.0) || (NAN(fVar45))) && (fVar45 < INFINITY)) {
        bVar42 = false;
        bVar43 = false;
      }
    }
    else {
      fVar45 = (patch->ring).items[3].vertex_crease_weight;
      bVar42 = false;
      bVar43 = false;
      if (((fVar45 == 0.0) && (!NAN(fVar45))) &&
         (bVar42 = bVar44, bVar43 = bVar26, uVar3 != 3 || iVar37 == -1)) {
        bVar42 = (uVar3 == 4 && iVar37 == -1) && bVar44;
        bVar43 = uVar3 == 4 && iVar37 == -1;
      }
    }
    if (depth < 10) {
      if ((bool)(bVar25 & bVar24 & bVar23 & bVar42)) {
LAB_00e324eb:
        BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::init
                  ((BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_3480,
                   (EVP_PKEY_CTX *)patch);
        BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
                  ((BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_3480,
                   (uv->field_0).field_0.x,(uv->field_0).field_0.y,this->P,this->dPdu,this->dPdv,
                   this->ddPdudu,this->ddPdvdv,this->ddPdudv,local_3540);
        goto LAB_00e3253f;
      }
      plVar31 = local_3180;
      lVar32 = 0;
      do {
        lVar33 = 0xd00;
        plVar36 = plVar31;
        do {
          plVar36[-0x50] = (long)(plVar36 + -0x58);
          plVar36[-0x47] = 0;
          *plVar36 = (long)(plVar36 + -0x40);
          plVar36 = plVar36 + 0x68;
          lVar33 = lVar33 + -0x340;
        } while (lVar33 != 0);
        lVar32 = lVar32 + 0xd00;
        plVar31 = plVar31 + 0x1a0;
      } while (lVar32 != 0x3400);
      CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::subdivide
                (patch,(array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
                        *)&local_3480);
      fVar45 = (uv->field_0).field_0.x;
      fVar51 = (uv->field_0).field_0.y;
      if (0.5 <= fVar51) {
        if (fVar45 <= 0.5) {
          lVar32 = 0;
          do {
            uVar22 = *(undefined8 *)((long)local_d80 + lVar32 + 8);
            puVar1 = (undefined8 *)((long)(patch->ring).items[0].crease_weight.arr + lVar32 + -0x40)
            ;
            *puVar1 = *(undefined8 *)((long)local_d80 + lVar32);
            puVar1[1] = uVar22;
            DynamicStackArray<float,_16UL,_64UL>::operator=
                      ((DynamicStackArray<float,_16UL,_64UL> *)(puVar1 + 8),
                       (DynamicStackArray<float,_16UL,_64UL> *)((long)DStack_d40.arr + lVar32));
            uVar22 = *(undefined8 *)((long)local_cc0 + lVar32 + 8);
            pDVar2 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                     ((long)&(patch->ring).items[0].ring.arr[0].field_0 + lVar32);
            pDVar2[-1].data = *(vfloat_impl<4> **)((long)local_cc0 + lVar32);
            *(undefined8 *)&pDVar2[-1].field_0x208 = uVar22;
            uVar22 = *(undefined8 *)((long)local_cc0 + lVar32 + 0x18);
            *(undefined8 *)&pDVar2[-1].field_0x210 =
                 *(undefined8 *)((long)local_cc0 + lVar32 + 0x10);
            *(undefined8 *)&pDVar2[-1].field_0x218 = uVar22;
            DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL>::operator=
                      (pDVar2,(DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                              ((long)&aDStack_c80[0].arr[0].field_0 + lVar32));
            lVar32 = lVar32 + 0x340;
          } while (lVar32 != 0xd00);
          fVar45 = fVar45 + fVar45;
          fVar51 = fVar51 + fVar51 + -1.0;
        }
        else {
          lVar32 = 0;
          do {
            uVar22 = *(undefined8 *)((long)local_1a80 + lVar32 + 8);
            puVar1 = (undefined8 *)((long)(patch->ring).items[0].crease_weight.arr + lVar32 + -0x40)
            ;
            *puVar1 = *(undefined8 *)((long)local_1a80 + lVar32);
            puVar1[1] = uVar22;
            DynamicStackArray<float,_16UL,_64UL>::operator=
                      ((DynamicStackArray<float,_16UL,_64UL> *)(puVar1 + 8),
                       (DynamicStackArray<float,_16UL,_64UL> *)((long)DStack_1a40.arr + lVar32));
            uVar22 = *(undefined8 *)((long)local_19c0 + lVar32 + 8);
            pDVar2 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                     ((long)&(patch->ring).items[0].ring.arr[0].field_0 + lVar32);
            pDVar2[-1].data = *(vfloat_impl<4> **)((long)local_19c0 + lVar32);
            *(undefined8 *)&pDVar2[-1].field_0x208 = uVar22;
            uVar22 = *(undefined8 *)((long)local_19c0 + lVar32 + 0x18);
            *(undefined8 *)&pDVar2[-1].field_0x210 =
                 *(undefined8 *)((long)local_19c0 + lVar32 + 0x10);
            *(undefined8 *)&pDVar2[-1].field_0x218 = uVar22;
            DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL>::operator=
                      (pDVar2,(DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                              ((long)&aDStack_1980[0].arr[0].field_0 + lVar32));
            lVar32 = lVar32 + 0x340;
          } while (lVar32 != 0xd00);
          fVar45 = fVar45 + fVar45 + -1.0;
          fVar51 = fVar51 + fVar51 + -1.0;
        }
      }
      else if (0.5 <= fVar45) {
        lVar32 = 0;
        do {
          uVar22 = *(undefined8 *)((long)local_2780 + lVar32 + 8);
          puVar1 = (undefined8 *)((long)(patch->ring).items[0].crease_weight.arr + lVar32 + -0x40);
          *puVar1 = *(undefined8 *)((long)local_2780 + lVar32);
          puVar1[1] = uVar22;
          DynamicStackArray<float,_16UL,_64UL>::operator=
                    ((DynamicStackArray<float,_16UL,_64UL> *)(puVar1 + 8),
                     (DynamicStackArray<float,_16UL,_64UL> *)((long)DStack_2740.arr + lVar32));
          uVar22 = *(undefined8 *)((long)local_26c0 + lVar32 + 8);
          pDVar2 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                   ((long)&(patch->ring).items[0].ring.arr[0].field_0 + lVar32);
          pDVar2[-1].data = *(vfloat_impl<4> **)((long)local_26c0 + lVar32);
          *(undefined8 *)&pDVar2[-1].field_0x208 = uVar22;
          uVar22 = *(undefined8 *)((long)local_26c0 + lVar32 + 0x18);
          *(undefined8 *)&pDVar2[-1].field_0x210 = *(undefined8 *)((long)local_26c0 + lVar32 + 0x10)
          ;
          *(undefined8 *)&pDVar2[-1].field_0x218 = uVar22;
          DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL>::operator=
                    (pDVar2,(DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                            ((long)&aDStack_2680[0].arr[0].field_0 + lVar32));
          lVar32 = lVar32 + 0x340;
        } while (lVar32 != 0xd00);
        fVar45 = fVar45 + fVar45 + -1.0;
        fVar51 = fVar51 + fVar51;
      }
      else {
        lVar32 = 0;
        do {
          uVar22 = *(undefined8 *)((long)&local_3480 + lVar32 + 8);
          puVar1 = (undefined8 *)((long)(patch->ring).items[0].crease_weight.arr + lVar32 + -0x40);
          *puVar1 = *(undefined8 *)((long)&local_3480 + lVar32);
          puVar1[1] = uVar22;
          DynamicStackArray<float,_16UL,_64UL>::operator=
                    ((DynamicStackArray<float,_16UL,_64UL> *)(puVar1 + 8),
                     (DynamicStackArray<float,_16UL,_64UL> *)((long)&local_3440 + lVar32));
          uVar22 = *(undefined8 *)((long)&local_33c0 + lVar32 + 8);
          puVar1 = (undefined8 *)((long)((patch->ring).items[0].ring.arr + -4) + lVar32);
          *puVar1 = *(undefined8 *)((long)&local_33c0 + lVar32);
          puVar1[1] = uVar22;
          uVar22 = *(undefined8 *)((long)&local_33b0 + lVar32 + 8);
          puVar1 = (undefined8 *)((long)((patch->ring).items[0].ring.arr + -3) + lVar32);
          *puVar1 = *(undefined8 *)((long)&local_33b0 + lVar32);
          puVar1[1] = uVar22;
          DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL>::operator=
                    ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                     ((long)&(patch->ring).items[0].ring.arr[0].field_0 + lVar32),
                     (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                     ((long)&local_3380 + lVar32));
          lVar32 = lVar32 + 0x340;
        } while (lVar32 != 0xd00);
        fVar45 = fVar45 + fVar45;
        fVar51 = fVar51 + fVar51;
      }
      aVar11.field_0.y = fVar51;
      aVar11.field_0.x = fVar45;
      uv->field_0 = aVar11;
      local_3540 = local_3540 + local_3540;
      depth = depth + 1;
      puVar40 = local_380;
      paVar39 = local_80;
      do {
        paVar39 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(paVar39->v + -0x340);
        lVar32 = -0xd00;
        puVar34 = puVar40;
        do {
          puVar4 = *(undefined1 **)(puVar34 + 0x2c0);
          if (puVar4 != (undefined1 *)0x0 && puVar34 + 0xc0 != puVar4) {
            alignedFree(puVar4);
          }
          puVar4 = *(undefined1 **)(puVar34 + 0x40);
          if (puVar4 != (undefined1 *)0x0 && puVar34 != puVar4) {
            operator_delete__(puVar4);
          }
          puVar34 = puVar34 + -0x340;
          lVar32 = lVar32 + 0x340;
        } while (lVar32 != 0);
        puVar40 = puVar40 + -0xd00;
      } while (paVar39 != &local_3480);
      bVar24 = true;
    }
    else {
      if ((bool)(bVar41 & bVar28 & bVar27 & bVar43)) goto LAB_00e324eb;
      pBVar38 = border3;
      GregoryPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::init_crackfix
                ((GregoryPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_3480,patch
                 ,border0,border1,border2,border3);
      fVar45 = (uv->field_0).field_0.x;
      fVar51 = (uv->field_0).field_0.y;
      aVar29 = (uv->field_0).field_0;
      pvVar5 = this->P;
      pvVar6 = this->dPdu;
      pvVar7 = this->dPdv;
      pvVar8 = this->ddPdudu;
      pvVar9 = this->ddPdvdv;
      pvVar10 = this->ddPdudv;
      if (pvVar5 != (vfloat_impl<4> *)0x0) {
        auVar62._4_4_ = -(uint)(fVar45 == 0.0);
        auVar62._0_4_ = -(uint)(fVar45 == 1.0);
        auVar62._8_4_ = -(uint)(fVar51 == 0.0);
        auVar62._12_4_ = -(uint)(fVar51 == 1.0);
        iVar37 = movmskps((int)pBVar38,auVar62);
        fVar46 = local_3420;
        fVar74 = fStack_341c;
        fVar75 = fStack_3418;
        fVar73 = fStack_3414;
        fVar77 = local_33e0;
        fVar78 = fStack_33dc;
        fVar79 = fStack_33d8;
        fVar47 = fStack_33d4;
        fVar76 = local_3430;
        fVar50 = fStack_342c;
        fVar48 = fStack_3428;
        fVar71 = fStack_3424;
        fVar80 = local_33f0;
        fVar90 = fStack_33ec;
        fVar58 = fStack_33e8;
        fVar60 = fStack_33e4;
        if (iVar37 == 0) {
          fVar46 = fVar45 + fVar51;
          auVar61._4_4_ = fVar51;
          auVar61._0_4_ = fVar46;
          auVar61._8_8_ = 0;
          auVar12._4_4_ = fVar51;
          auVar12._0_4_ = fVar46;
          auVar12._8_8_ = 0;
          auVar62 = rcpss(auVar61,auVar12);
          fVar71 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          fVar47 = 1.0 - fVar45;
          fVar46 = fVar47 + fVar51;
          auVar62 = rcpss(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
          fVar73 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          fVar48 = 1.0 - fVar51;
          fVar46 = (2.0 - fVar45) - fVar51;
          auVar62 = rcpss(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
          fVar76 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          auVar53._0_4_ = (fVar45 + 1.0) - fVar51;
          auVar53._4_4_ = fVar51;
          auVar53._8_8_ = 0;
          auVar63._4_4_ = fVar51;
          auVar63._0_4_ = auVar53._0_4_;
          auVar63._8_8_ = 0;
          auVar62 = rcpss(auVar63,auVar53);
          fVar80 = (2.0 - auVar53._0_4_ * auVar62._0_4_) * auVar62._0_4_;
          fVar46 = fVar73 * (local_3420 * fVar51 + local_3370 * fVar47);
          fVar74 = fVar73 * (fStack_341c * fVar51 + fStack_336c * fVar47);
          fVar75 = fVar73 * (fStack_3418 * fVar51 + fStack_3368 * fVar47);
          fVar73 = fVar73 * (fStack_3414 * fVar51 + fStack_3364 * fVar47);
          fVar77 = fVar76 * (local_3350 * fVar48 + fVar47 * local_33e0);
          fVar78 = fVar76 * (fStack_334c * fVar48 + fVar47 * fStack_33dc);
          fVar79 = fVar76 * (fStack_3348 * fVar48 + fVar47 * fStack_33d8);
          fVar47 = fVar76 * (fStack_3344 * fVar48 + fVar47 * fStack_33d4);
          fVar76 = fVar71 * (local_3380.v[0] * fVar51 + local_3430 * fVar45);
          fVar50 = fVar71 * (local_3380.v[1] * fVar51 + fStack_342c * fVar45);
          fVar48 = fVar71 * (local_3380.v[2] * fVar51 + fStack_3428 * fVar45);
          fVar71 = fVar71 * (local_3380.v[3] * fVar51 + fStack_3424 * fVar45);
          fVar80 = fVar80 * (fVar48 * local_33f0 + local_3360 * fVar45);
          fVar90 = fVar80 * (fVar48 * fStack_33ec + fStack_335c * fVar45);
          fVar58 = fVar80 * (fVar48 * fStack_33e8 + fStack_3358 * fVar45);
          fVar60 = fVar80 * (fVar48 * fStack_33e4 + fStack_3354 * fVar45);
        }
        fVar49 = 1.0 - fVar45;
        fVar59 = fVar45 * fVar45 * 3.0 * fVar49;
        fVar81 = fVar49 * fVar49 * fVar49;
        fVar52 = fVar45 * 3.0 * fVar49 * fVar49;
        fVar49 = 1.0 - fVar51;
        fVar86 = fVar51 * fVar51 * fVar51;
        fVar88 = fVar51 * fVar51 * 3.0 * fVar49;
        fVar94 = fVar49 * fVar49 * fVar49;
        fVar49 = fVar51 * 3.0 * fVar49 * fVar49;
        fVar82 = fVar45 * fVar45 * fVar45;
        (pvVar5->field_0).v[0] =
             fVar86 * (fVar81 * local_33c0.v[0] +
                      fVar52 * local_33b0.v[0] + fVar59 * local_33a0 + fVar82 * local_3390) +
             (local_3400 * fVar81 + fVar80 * fVar52 + fVar77 * fVar59 + local_33d0 * fVar82) *
             fVar88 + (local_3440.v[0] * fVar81 +
                      fVar76 * fVar52 + fVar46 * fVar59 + local_3410 * fVar82) * fVar49 +
             (local_3480.v[0] * fVar81 +
             local_3470 * fVar52 + local_3460 * fVar59 + local_3450 * fVar82) * fVar94;
        (pvVar5->field_0).v[1] =
             fVar86 * (fVar81 * local_33c0.v[1] +
                      fVar52 * local_33b0.v[1] + fVar59 * fStack_339c + fVar82 * fStack_338c) +
             (fStack_33fc * fVar81 + fVar90 * fVar52 + fVar78 * fVar59 + fStack_33cc * fVar82) *
             fVar88 + (local_3440.v[1] * fVar81 +
                      fVar50 * fVar52 + fVar74 * fVar59 + fStack_340c * fVar82) * fVar49 +
             (local_3480.v[1] * fVar81 +
             fStack_346c * fVar52 + fStack_345c * fVar59 + fStack_344c * fVar82) * fVar94;
        (pvVar5->field_0).v[2] =
             fVar86 * (fVar81 * local_33c0.v[2] +
                      fVar52 * local_33b0.v[2] + fVar59 * fStack_3398 + fVar82 * fStack_3388) +
             (fStack_33f8 * fVar81 + fVar58 * fVar52 + fVar79 * fVar59 + fStack_33c8 * fVar82) *
             fVar88 + (local_3440.v[2] * fVar81 +
                      fVar48 * fVar52 + fVar75 * fVar59 + fStack_3408 * fVar82) * fVar49 +
             (local_3480.v[2] * fVar81 +
             fStack_3468 * fVar52 + fStack_3458 * fVar59 + fStack_3448 * fVar82) * fVar94;
        (pvVar5->field_0).v[3] =
             fVar86 * (fVar81 * local_33c0.v[3] +
                      fVar52 * local_33b0.v[3] + fVar59 * fStack_3394 + fVar82 * fStack_3384) +
             (fStack_33f4 * fVar81 + fVar60 * fVar52 + fVar47 * fVar59 + fStack_33c4 * fVar82) *
             fVar88 + (local_3440.v[3] * fVar81 +
                      fVar71 * fVar52 + fVar73 * fVar59 + fStack_3404 * fVar82) * fVar49 +
             (local_3480.v[3] * fVar81 +
             fStack_3464 * fVar52 + fStack_3454 * fVar59 + fStack_3444 * fVar82) * fVar94;
      }
      if (pvVar6 != (vfloat_impl<4> *)0x0) {
        auVar54._4_4_ = -(uint)(fVar45 == 0.0);
        auVar54._0_4_ = -(uint)(fVar45 == 1.0);
        auVar54._8_4_ = -(uint)(fVar51 == 0.0);
        auVar54._12_4_ = -(uint)(fVar51 == 1.0);
        iVar37 = movmskps((int)pvVar5,auVar54);
        fVar49 = aVar29.y;
        fVar46 = local_3420;
        fVar74 = fStack_341c;
        fVar75 = fStack_3418;
        fVar73 = fStack_3414;
        fVar77 = local_33e0;
        fVar78 = fStack_33dc;
        fVar79 = fStack_33d8;
        fVar47 = fStack_33d4;
        fVar76 = local_33f0;
        fVar50 = fStack_33ec;
        fVar48 = fStack_33e8;
        fVar71 = fStack_33e4;
        fVar80 = local_3430;
        fVar90 = fStack_342c;
        fVar58 = fStack_3428;
        fVar60 = fStack_3424;
        if (iVar37 == 0) {
          fVar46 = fVar45 + fVar51;
          auVar64._4_4_ = fVar49;
          auVar64._0_4_ = fVar46;
          auVar64._8_8_ = 0;
          auVar13._4_4_ = fVar49;
          auVar13._0_4_ = fVar46;
          auVar13._8_8_ = 0;
          auVar62 = rcpss(auVar64,auVar13);
          fVar48 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          fVar47 = 1.0 - fVar45;
          fVar46 = fVar47 + fVar51;
          auVar62 = rcpss(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
          fVar73 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          fVar50 = 1.0 - fVar51;
          fVar46 = (2.0 - fVar45) - fVar51;
          auVar62 = rcpss(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
          fVar76 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          auVar55._0_4_ = (fVar45 + 1.0) - fVar51;
          auVar55._4_4_ = fVar51;
          auVar55._8_8_ = 0;
          auVar65._4_4_ = fVar49;
          auVar65._0_4_ = auVar55._0_4_;
          auVar65._8_8_ = 0;
          auVar62 = rcpss(auVar65,auVar55);
          fVar71 = (2.0 - auVar55._0_4_ * auVar62._0_4_) * auVar62._0_4_;
          fVar46 = fVar73 * (local_3420 * fVar51 + local_3370 * fVar47);
          fVar74 = fVar73 * (fStack_341c * fVar51 + fStack_336c * fVar47);
          fVar75 = fVar73 * (fStack_3418 * fVar51 + fStack_3368 * fVar47);
          fVar73 = fVar73 * (fStack_3414 * fVar51 + fStack_3364 * fVar47);
          fVar77 = fVar76 * (local_3350 * fVar50 + fVar47 * local_33e0);
          fVar78 = fVar76 * (fStack_334c * fVar50 + fVar47 * fStack_33dc);
          fVar79 = fVar76 * (fStack_3348 * fVar50 + fVar47 * fStack_33d8);
          fVar47 = fVar76 * (fStack_3344 * fVar50 + fVar47 * fStack_33d4);
          fVar76 = fVar71 * (fVar50 * local_33f0 + local_3360 * fVar45);
          fVar50 = fVar71 * (fVar50 * fStack_33ec + fStack_335c * fVar45);
          fVar48 = fVar71 * (fVar50 * fStack_33e8 + fStack_3358 * fVar45);
          fVar71 = fVar71 * (fVar50 * fStack_33e4 + fStack_3354 * fVar45);
          fVar80 = fVar48 * (local_3380.v[0] * fVar51 + local_3430 * fVar45);
          fVar90 = fVar48 * (local_3380.v[1] * fVar51 + fStack_342c * fVar45);
          fVar58 = fVar48 * (local_3380.v[2] * fVar51 + fStack_3428 * fVar45);
          fVar60 = fVar48 * (local_3380.v[3] * fVar51 + fStack_3424 * fVar45);
        }
        fVar49 = 1.0 - fVar45;
        fVar83 = fVar49 * fVar49;
        fVar52 = fVar45 * fVar49 + fVar45 * fVar49;
        fVar59 = fVar45 * fVar45;
        fVar84 = fVar83 * -3.0;
        fVar96 = (fVar83 - fVar52) * 3.0;
        fVar95 = (fVar52 - fVar59) * 3.0;
        fVar81 = fVar59 * 3.0;
        fVar86 = 1.0 - fVar51;
        fVar88 = fVar86 * fVar86;
        fVar52 = fVar86 * fVar88;
        fVar89 = fVar51 * 3.0 * fVar88;
        fVar87 = fVar51 * fVar51;
        fVar94 = fVar87 * 3.0;
        fVar92 = fVar86 * fVar94;
        fVar82 = fVar51 * fVar87;
        (pvVar6->field_0).v[0] =
             (fVar82 * (fVar84 * local_33c0.v[0] +
                       fVar96 * local_33b0.v[0] + fVar95 * local_33a0 + fVar81 * local_3390) +
              (local_3400 * fVar84 + fVar76 * fVar96 + fVar77 * fVar95 + local_33d0 * fVar81) *
              fVar92 + (local_3440.v[0] * fVar84 +
                       fVar80 * fVar96 + fVar46 * fVar95 + local_3410 * fVar81) * fVar89 +
             (local_3480.v[0] * fVar84 +
             local_3470 * fVar96 + local_3460 * fVar95 + local_3450 * fVar81) * fVar52) * local_3540
        ;
        (pvVar6->field_0).v[1] =
             (fVar82 * (fVar84 * local_33c0.v[1] +
                       fVar96 * local_33b0.v[1] + fVar95 * fStack_339c + fVar81 * fStack_338c) +
              (fStack_33fc * fVar84 + fVar50 * fVar96 + fVar78 * fVar95 + fStack_33cc * fVar81) *
              fVar92 + (local_3440.v[1] * fVar84 +
                       fVar90 * fVar96 + fVar74 * fVar95 + fStack_340c * fVar81) * fVar89 +
             (local_3480.v[1] * fVar84 +
             fStack_346c * fVar96 + fStack_345c * fVar95 + fStack_344c * fVar81) * fVar52) *
             local_3540;
        (pvVar6->field_0).v[2] =
             (fVar82 * (fVar84 * local_33c0.v[2] +
                       fVar96 * local_33b0.v[2] + fVar95 * fStack_3398 + fVar81 * fStack_3388) +
              (fStack_33f8 * fVar84 + fVar48 * fVar96 + fVar79 * fVar95 + fStack_33c8 * fVar81) *
              fVar92 + (local_3440.v[2] * fVar84 +
                       fVar58 * fVar96 + fVar75 * fVar95 + fStack_3408 * fVar81) * fVar89 +
             (local_3480.v[2] * fVar84 +
             fStack_3468 * fVar96 + fStack_3458 * fVar95 + fStack_3448 * fVar81) * fVar52) *
             local_3540;
        (pvVar6->field_0).v[3] =
             (fVar82 * (fVar84 * local_33c0.v[3] +
                       fVar96 * local_33b0.v[3] + fVar95 * fStack_3394 + fVar81 * fStack_3384) +
              (fStack_33f4 * fVar84 + fVar71 * fVar96 + fVar47 * fVar95 + fStack_33c4 * fVar81) *
              fVar92 + (local_3440.v[3] * fVar84 +
                       fVar60 * fVar96 + fVar73 * fVar95 + fStack_3404 * fVar81) * fVar89 +
             (local_3480.v[3] * fVar84 +
             fStack_3464 * fVar96 + fStack_3454 * fVar95 + fStack_3444 * fVar81) * fVar52) *
             local_3540;
        fVar46 = local_3430;
        fVar74 = fStack_342c;
        fVar75 = fStack_3428;
        fVar73 = fStack_3424;
        fVar77 = local_3420;
        fVar78 = fStack_341c;
        fVar79 = fStack_3418;
        fVar47 = fStack_3414;
        fVar76 = local_33e0;
        fVar50 = fStack_33dc;
        fVar48 = fStack_33d8;
        fVar71 = fStack_33d4;
        fVar80 = local_33f0;
        fVar90 = fStack_33ec;
        fVar58 = fStack_33e8;
        fVar60 = fStack_33e4;
        if ((char)iVar37 == '\0') {
          fVar46 = fVar45 + fVar51;
          auVar72._4_4_ = fVar51;
          auVar72._0_4_ = fVar46;
          auVar72._8_8_ = 0;
          auVar14._4_4_ = fVar51;
          auVar14._0_4_ = fVar46;
          auVar14._8_8_ = 0;
          auVar62 = rcpss(auVar72,auVar14);
          fVar73 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          fVar46 = fVar49 + fVar51;
          auVar62 = rcpss(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
          fVar47 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          fVar46 = (2.0 - fVar45) - fVar51;
          auVar62 = rcpss(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
          fVar48 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          fVar46 = (fVar45 + 1.0) - fVar51;
          auVar85._4_4_ = fVar51;
          auVar85._0_4_ = fVar46;
          auVar85._8_8_ = 0;
          auVar21._4_4_ = fVar51;
          auVar21._0_4_ = fVar46;
          auVar21._8_8_ = 0;
          auVar62 = rcpss(auVar85,auVar21);
          fVar50 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          fVar46 = fVar73 * (local_3380.v[0] * fVar51 + local_3430 * fVar45);
          fVar74 = fVar73 * (local_3380.v[1] * fVar51 + fStack_342c * fVar45);
          fVar75 = fVar73 * (local_3380.v[2] * fVar51 + fStack_3428 * fVar45);
          fVar73 = fVar73 * (local_3380.v[3] * fVar51 + fStack_3424 * fVar45);
          fVar77 = fVar47 * (local_3420 * fVar51 + local_3370 * fVar49);
          fVar78 = fVar47 * (fStack_341c * fVar51 + fStack_336c * fVar49);
          fVar79 = fVar47 * (fStack_3418 * fVar51 + fStack_3368 * fVar49);
          fVar47 = fVar47 * (fStack_3414 * fVar51 + fStack_3364 * fVar49);
          fVar76 = fVar48 * (local_3350 * fVar86 + fVar49 * local_33e0);
          fVar50 = fVar48 * (fStack_334c * fVar86 + fVar49 * fStack_33dc);
          fVar48 = fVar48 * (fStack_3348 * fVar86 + fVar49 * fStack_33d8);
          fVar71 = fVar48 * (fStack_3344 * fVar86 + fVar49 * fStack_33d4);
          fVar80 = fVar50 * (fVar86 * local_33f0 + local_3360 * fVar45);
          fVar90 = fVar50 * (fVar86 * fStack_33ec + fStack_335c * fVar45);
          fVar58 = fVar50 * (fVar86 * fStack_33e8 + fStack_3358 * fVar45);
          fVar60 = fVar50 * (fVar86 * fStack_33e4 + fStack_3354 * fVar45);
        }
        fVar84 = fVar49 * fVar83;
        fVar83 = fVar45 * 3.0 * fVar83;
        fVar81 = fVar81 * fVar49;
        fVar52 = fVar86 * fVar51 + fVar86 * fVar51;
        fVar59 = fVar59 * fVar45;
        fVar82 = fVar88 * -3.0;
        fVar49 = (fVar88 - fVar52) * 3.0;
        fVar52 = (fVar52 - fVar87) * 3.0;
        (pvVar7->field_0).v[0] =
             local_3540 *
             (fVar94 * (fVar84 * local_33c0.v[0] +
                       fVar83 * local_33b0.v[0] + fVar81 * local_33a0 + fVar59 * local_3390) +
              (local_3400 * fVar84 + fVar80 * fVar83 + fVar76 * fVar81 + local_33d0 * fVar59) *
              fVar52 + (local_3440.v[0] * fVar84 +
                       fVar46 * fVar83 + fVar77 * fVar81 + local_3410 * fVar59) * fVar49 +
             (local_3480.v[0] * fVar84 +
             local_3470 * fVar83 + local_3460 * fVar81 + local_3450 * fVar59) * fVar82);
        (pvVar7->field_0).v[1] =
             local_3540 *
             (fVar94 * (fVar84 * local_33c0.v[1] +
                       fVar83 * local_33b0.v[1] + fVar81 * fStack_339c + fVar59 * fStack_338c) +
              (fStack_33fc * fVar84 + fVar90 * fVar83 + fVar50 * fVar81 + fStack_33cc * fVar59) *
              fVar52 + (local_3440.v[1] * fVar84 +
                       fVar74 * fVar83 + fVar78 * fVar81 + fStack_340c * fVar59) * fVar49 +
             (local_3480.v[1] * fVar84 +
             fStack_346c * fVar83 + fStack_345c * fVar81 + fStack_344c * fVar59) * fVar82);
        (pvVar7->field_0).v[2] =
             local_3540 *
             (fVar94 * (fVar84 * local_33c0.v[2] +
                       fVar83 * local_33b0.v[2] + fVar81 * fStack_3398 + fVar59 * fStack_3388) +
              (fStack_33f8 * fVar84 + fVar58 * fVar83 + fVar48 * fVar81 + fStack_33c8 * fVar59) *
              fVar52 + (local_3440.v[2] * fVar84 +
                       fVar75 * fVar83 + fVar79 * fVar81 + fStack_3408 * fVar59) * fVar49 +
             (local_3480.v[2] * fVar84 +
             fStack_3468 * fVar83 + fStack_3458 * fVar81 + fStack_3448 * fVar59) * fVar82);
        (pvVar7->field_0).v[3] =
             local_3540 *
             (fVar94 * (fVar84 * local_33c0.v[3] +
                       fVar83 * local_33b0.v[3] + fVar81 * fStack_3394 + fVar59 * fStack_3384) +
              (fStack_33f4 * fVar84 + fVar60 * fVar83 + fVar71 * fVar81 + fStack_33c4 * fVar59) *
              fVar52 + (local_3440.v[3] * fVar84 +
                       fVar73 * fVar83 + fVar47 * fVar81 + fStack_3404 * fVar59) * fVar49 +
             (local_3480.v[3] * fVar84 +
             fStack_3464 * fVar83 + fStack_3454 * fVar81 + fStack_3444 * fVar59) * fVar82);
      }
      if (pvVar8 != (vfloat_impl<4> *)0x0) {
        auVar15._4_4_ = -(uint)(fVar51 == 0.0);
        auVar15._0_4_ = -(uint)(fVar45 == 0.0);
        auVar15._8_4_ = -(uint)(fVar45 == 1.0);
        auVar15._12_4_ = -(uint)(fVar51 == 1.0);
        iVar37 = movmskps((int)pvVar7,auVar15);
        fVar46 = local_3430;
        fVar74 = fStack_342c;
        fVar75 = fStack_3428;
        fVar73 = fStack_3424;
        fVar77 = local_3420;
        fVar78 = fStack_341c;
        fVar79 = fStack_3418;
        fVar47 = fStack_3414;
        fVar76 = local_33f0;
        fVar50 = fStack_33ec;
        fVar48 = fStack_33e8;
        fVar71 = fStack_33e4;
        fVar80 = local_33e0;
        fVar90 = fStack_33dc;
        fVar58 = fStack_33d8;
        fVar60 = fStack_33d4;
        if (iVar37 == 0) {
          fVar46 = fVar45 + fVar51;
          auVar66._4_4_ = fVar51;
          auVar66._0_4_ = fVar46;
          auVar66._8_8_ = 0;
          auVar16._4_4_ = fVar51;
          auVar16._0_4_ = fVar46;
          auVar16._8_8_ = 0;
          auVar62 = rcpss(auVar66,auVar16);
          fVar73 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          fVar48 = 1.0 - fVar45;
          fVar46 = fVar48 + fVar51;
          auVar62 = rcpss(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
          fVar47 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          fVar71 = 1.0 - fVar51;
          fVar46 = (2.0 - fVar45) - fVar51;
          auVar62 = rcpss(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
          fVar80 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          auVar56._0_4_ = (fVar45 + 1.0) - fVar51;
          auVar56._4_4_ = fVar51;
          auVar56._8_8_ = 0;
          auVar67._4_4_ = fVar51;
          auVar67._0_4_ = auVar56._0_4_;
          auVar67._8_8_ = 0;
          auVar62 = rcpss(auVar67,auVar56);
          fVar90 = (2.0 - auVar56._0_4_ * auVar62._0_4_) * auVar62._0_4_;
          fVar46 = fVar73 * (local_3380.v[0] * fVar51 + local_3430 * fVar45);
          fVar74 = fVar73 * (local_3380.v[1] * fVar51 + fStack_342c * fVar45);
          fVar75 = fVar73 * (local_3380.v[2] * fVar51 + fStack_3428 * fVar45);
          fVar73 = fVar73 * (local_3380.v[3] * fVar51 + fStack_3424 * fVar45);
          fVar77 = fVar47 * (local_3420 * fVar51 + local_3370 * fVar48);
          fVar78 = fVar47 * (fStack_341c * fVar51 + fStack_336c * fVar48);
          fVar79 = fVar47 * (fStack_3418 * fVar51 + fStack_3368 * fVar48);
          fVar47 = fVar47 * (fStack_3414 * fVar51 + fStack_3364 * fVar48);
          fVar76 = fVar90 * (fVar71 * local_33f0 + local_3360 * fVar45);
          fVar50 = fVar90 * (fVar71 * fStack_33ec + fStack_335c * fVar45);
          fVar48 = fVar90 * (fVar71 * fStack_33e8 + fStack_3358 * fVar45);
          fVar71 = fVar90 * (fVar71 * fStack_33e4 + fStack_3354 * fVar45);
          fVar80 = fVar80 * (local_3350 * fVar71 + fVar48 * local_33e0);
          fVar90 = fVar80 * (fStack_334c * fVar71 + fVar48 * fStack_33dc);
          fVar58 = fVar80 * (fStack_3348 * fVar71 + fVar48 * fStack_33d8);
          fVar60 = fVar80 * (fStack_3344 * fVar71 + fVar48 * fStack_33d4);
        }
        fVar88 = 1.0 - fVar45;
        fVar89 = fVar88 * 6.0;
        fVar87 = (fVar45 - (fVar88 + fVar88)) * 6.0;
        fVar82 = (fVar88 - (fVar45 + fVar45)) * 6.0;
        fVar59 = fVar45 * 6.0;
        fVar95 = fVar51 * fVar51;
        fVar86 = 1.0 - fVar51;
        fVar83 = fVar86 * fVar86;
        fVar49 = fVar86 * fVar83;
        fVar94 = fVar51 * 3.0 * fVar83;
        fVar92 = fVar95 * 3.0;
        fVar84 = fVar86 * fVar92;
        fVar81 = fVar51 * fVar95;
        fVar52 = local_3540 * local_3540;
        (pvVar8->field_0).v[0] =
             (fVar81 * (fVar89 * local_33c0.v[0] +
                       fVar87 * local_33b0.v[0] + fVar82 * local_33a0 + fVar59 * local_3390) +
              (local_3400 * fVar89 + fVar76 * fVar87 + fVar80 * fVar82 + local_33d0 * fVar59) *
              fVar84 + (local_3440.v[0] * fVar89 +
                       fVar46 * fVar87 + fVar77 * fVar82 + local_3410 * fVar59) * fVar94 +
             (local_3480.v[0] * fVar89 +
             local_3470 * fVar87 + local_3460 * fVar82 + local_3450 * fVar59) * fVar49) * fVar52;
        (pvVar8->field_0).v[1] =
             (fVar81 * (fVar89 * local_33c0.v[1] +
                       fVar87 * local_33b0.v[1] + fVar82 * fStack_339c + fVar59 * fStack_338c) +
              (fStack_33fc * fVar89 + fVar50 * fVar87 + fVar90 * fVar82 + fStack_33cc * fVar59) *
              fVar84 + (local_3440.v[1] * fVar89 +
                       fVar74 * fVar87 + fVar78 * fVar82 + fStack_340c * fVar59) * fVar94 +
             (local_3480.v[1] * fVar89 +
             fStack_346c * fVar87 + fStack_345c * fVar82 + fStack_344c * fVar59) * fVar49) * fVar52;
        (pvVar8->field_0).v[2] =
             (fVar81 * (fVar89 * local_33c0.v[2] +
                       fVar87 * local_33b0.v[2] + fVar82 * fStack_3398 + fVar59 * fStack_3388) +
              (fStack_33f8 * fVar89 + fVar48 * fVar87 + fVar58 * fVar82 + fStack_33c8 * fVar59) *
              fVar84 + (local_3440.v[2] * fVar89 +
                       fVar75 * fVar87 + fVar79 * fVar82 + fStack_3408 * fVar59) * fVar94 +
             (local_3480.v[2] * fVar89 +
             fStack_3468 * fVar87 + fStack_3458 * fVar82 + fStack_3448 * fVar59) * fVar49) * fVar52;
        (pvVar8->field_0).v[3] =
             (fVar81 * (fVar89 * local_33c0.v[3] +
                       fVar87 * local_33b0.v[3] + fVar82 * fStack_3394 + fVar59 * fStack_3384) +
              (fStack_33f4 * fVar89 + fVar71 * fVar87 + fVar60 * fVar82 + fStack_33c4 * fVar59) *
              fVar84 + (local_3440.v[3] * fVar89 +
                       fVar73 * fVar87 + fVar47 * fVar82 + fStack_3404 * fVar59) * fVar94 +
             (local_3480.v[3] * fVar89 +
             fStack_3464 * fVar87 + fStack_3454 * fVar82 + fStack_3444 * fVar59) * fVar49) * fVar52;
        fVar46 = local_3430;
        fVar74 = fStack_342c;
        fVar75 = fStack_3428;
        fVar73 = fStack_3424;
        fVar77 = local_3420;
        fVar78 = fStack_341c;
        fVar79 = fStack_3418;
        fVar47 = fStack_3414;
        fVar76 = local_33e0;
        fVar50 = fStack_33dc;
        fVar48 = fStack_33d8;
        fVar71 = fStack_33d4;
        fVar80 = local_33f0;
        fVar90 = fStack_33ec;
        fVar58 = fStack_33e8;
        fVar60 = fStack_33e4;
        if ((char)iVar37 == '\0') {
          fVar46 = fVar45 + fVar51;
          auVar68._4_4_ = fVar51;
          auVar68._0_4_ = fVar46;
          auVar68._8_8_ = 0;
          auVar17._4_4_ = fVar51;
          auVar17._0_4_ = fVar46;
          auVar17._8_8_ = 0;
          auVar62 = rcpss(auVar68,auVar17);
          fVar73 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          fVar46 = fVar88 + fVar51;
          auVar62 = rcpss(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
          fVar47 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          fVar46 = (2.0 - fVar45) - fVar51;
          auVar62 = rcpss(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
          fVar71 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          fVar46 = (fVar45 + 1.0) - fVar51;
          auVar70._4_4_ = fVar51;
          auVar70._0_4_ = fVar46;
          auVar70._8_8_ = 0;
          auVar18._4_4_ = fVar51;
          auVar18._0_4_ = fVar46;
          auVar18._8_8_ = 0;
          auVar62 = rcpss(auVar70,auVar18);
          fVar48 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          fVar46 = fVar73 * (local_3380.v[0] * fVar51 + local_3430 * fVar45);
          fVar74 = fVar73 * (local_3380.v[1] * fVar51 + fStack_342c * fVar45);
          fVar75 = fVar73 * (local_3380.v[2] * fVar51 + fStack_3428 * fVar45);
          fVar73 = fVar73 * (local_3380.v[3] * fVar51 + fStack_3424 * fVar45);
          fVar77 = fVar47 * (local_3420 * fVar51 + local_3370 * fVar88);
          fVar78 = fVar47 * (fStack_341c * fVar51 + fStack_336c * fVar88);
          fVar79 = fVar47 * (fStack_3418 * fVar51 + fStack_3368 * fVar88);
          fVar47 = fVar47 * (fStack_3414 * fVar51 + fStack_3364 * fVar88);
          fVar76 = fVar71 * (local_3350 * fVar86 + fVar88 * local_33e0);
          fVar50 = fVar71 * (fStack_334c * fVar86 + fVar88 * fStack_33dc);
          fVar48 = fVar71 * (fStack_3348 * fVar86 + fVar88 * fStack_33d8);
          fVar71 = fVar71 * (fStack_3344 * fVar86 + fVar88 * fStack_33d4);
          fVar80 = fVar48 * (local_33f0 * fVar86 + local_3360 * fVar45);
          fVar90 = fVar48 * (fStack_33ec * fVar86 + fStack_335c * fVar45);
          fVar58 = fVar48 * (fStack_33e8 * fVar86 + fStack_3358 * fVar45);
          fVar60 = fVar48 * (fStack_33e4 * fVar86 + fStack_3354 * fVar45);
        }
        fVar94 = fVar88 * fVar88;
        fVar82 = fVar88 * fVar94;
        fVar59 = fVar45 * 3.0 * fVar94;
        fVar91 = fVar45 * fVar45;
        fVar84 = fVar91 * 3.0;
        fVar87 = fVar88 * fVar84;
        fVar93 = fVar45 * fVar91;
        fVar96 = fVar86 * 6.0;
        fVar49 = (fVar51 - (fVar86 + fVar86)) * 6.0;
        fVar89 = (fVar86 - (fVar51 + fVar51)) * 6.0;
        fVar81 = fVar51 * 6.0;
        (pvVar9->field_0).v[0] =
             (fVar81 * (fVar82 * local_33c0.v[0] +
                       fVar59 * local_33b0.v[0] + fVar87 * local_33a0 + fVar93 * local_3390) +
              (local_3400 * fVar82 + fVar80 * fVar59 + fVar76 * fVar87 + local_33d0 * fVar93) *
              fVar89 + (local_3440.v[0] * fVar82 +
                       fVar46 * fVar59 + fVar77 * fVar87 + local_3410 * fVar93) * fVar49 +
             (local_3480.v[0] * fVar82 +
             local_3470 * fVar59 + local_3460 * fVar87 + local_3450 * fVar93) * fVar96) * fVar52;
        (pvVar9->field_0).v[1] =
             (fVar81 * (fVar82 * local_33c0.v[1] +
                       fVar59 * local_33b0.v[1] + fVar87 * fStack_339c + fVar93 * fStack_338c) +
              (fStack_33fc * fVar82 + fVar90 * fVar59 + fVar50 * fVar87 + fStack_33cc * fVar93) *
              fVar89 + (local_3440.v[1] * fVar82 +
                       fVar74 * fVar59 + fVar78 * fVar87 + fStack_340c * fVar93) * fVar49 +
             (local_3480.v[1] * fVar82 +
             fStack_346c * fVar59 + fStack_345c * fVar87 + fStack_344c * fVar93) * fVar96) * fVar52;
        (pvVar9->field_0).v[2] =
             (fVar81 * (fVar82 * local_33c0.v[2] +
                       fVar59 * local_33b0.v[2] + fVar87 * fStack_3398 + fVar93 * fStack_3388) +
              (fStack_33f8 * fVar82 + fVar58 * fVar59 + fVar48 * fVar87 + fStack_33c8 * fVar93) *
              fVar89 + (local_3440.v[2] * fVar82 +
                       fVar75 * fVar59 + fVar79 * fVar87 + fStack_3408 * fVar93) * fVar49 +
             (local_3480.v[2] * fVar82 +
             fStack_3468 * fVar59 + fStack_3458 * fVar87 + fStack_3448 * fVar93) * fVar96) * fVar52;
        (pvVar9->field_0).v[3] =
             (fVar81 * (fVar82 * local_33c0.v[3] +
                       fVar59 * local_33b0.v[3] + fVar87 * fStack_3394 + fVar93 * fStack_3384) +
              (fStack_33f4 * fVar82 + fVar60 * fVar59 + fVar71 * fVar87 + fStack_33c4 * fVar93) *
              fVar89 + (local_3440.v[3] * fVar82 +
                       fVar73 * fVar59 + fVar47 * fVar87 + fStack_3404 * fVar93) * fVar49 +
             (local_3480.v[3] * fVar82 +
             fStack_3464 * fVar59 + fStack_3454 * fVar87 + fStack_3444 * fVar93) * fVar96) * fVar52;
        fVar46 = local_3430;
        fVar74 = fStack_342c;
        fVar75 = fStack_3428;
        fVar73 = fStack_3424;
        fVar77 = local_3420;
        fVar78 = fStack_341c;
        fVar79 = fStack_3418;
        fVar47 = fStack_3414;
        fVar76 = local_33e0;
        fVar50 = fStack_33dc;
        fVar48 = fStack_33d8;
        fVar71 = fStack_33d4;
        fVar80 = local_33f0;
        fVar90 = fStack_33ec;
        fVar58 = fStack_33e8;
        fVar60 = fStack_33e4;
        if ((char)iVar37 == '\0') {
          fVar46 = fVar45 + fVar51;
          auVar69._4_4_ = fVar51;
          auVar69._0_4_ = fVar46;
          auVar69._8_8_ = 0;
          auVar19._4_4_ = fVar51;
          auVar19._0_4_ = fVar46;
          auVar19._8_8_ = 0;
          auVar62 = rcpss(auVar69,auVar19);
          fVar73 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          fVar46 = fVar88 + fVar51;
          auVar62 = rcpss(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
          fVar47 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          fVar46 = (2.0 - fVar45) - fVar51;
          auVar62 = rcpss(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
          fVar71 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          fVar46 = (fVar45 + 1.0) - fVar51;
          auVar57._4_4_ = fVar51;
          auVar57._0_4_ = fVar46;
          auVar57._8_8_ = 0;
          auVar20._4_4_ = fVar51;
          auVar20._0_4_ = fVar46;
          auVar20._8_8_ = 0;
          auVar62 = rcpss(auVar57,auVar20);
          fVar60 = (2.0 - fVar46 * auVar62._0_4_) * auVar62._0_4_;
          fVar46 = fVar73 * (local_3380.v[0] * fVar51 + local_3430 * fVar45);
          fVar74 = fVar73 * (local_3380.v[1] * fVar51 + fStack_342c * fVar45);
          fVar75 = fVar73 * (local_3380.v[2] * fVar51 + fStack_3428 * fVar45);
          fVar73 = fVar73 * (local_3380.v[3] * fVar51 + fStack_3424 * fVar45);
          fVar77 = fVar47 * (fVar51 * local_3420 + local_3370 * fVar88);
          fVar78 = fVar47 * (fVar51 * fStack_341c + fStack_336c * fVar88);
          fVar79 = fVar47 * (fVar51 * fStack_3418 + fStack_3368 * fVar88);
          fVar47 = fVar47 * (fVar51 * fStack_3414 + fStack_3364 * fVar88);
          fVar76 = fVar71 * (local_3350 * fVar86 + fVar88 * local_33e0);
          fVar50 = fVar71 * (fStack_334c * fVar86 + fVar88 * fStack_33dc);
          fVar48 = fVar71 * (fStack_3348 * fVar86 + fVar88 * fStack_33d8);
          fVar71 = fVar71 * (fStack_3344 * fVar86 + fVar88 * fStack_33d4);
          fVar80 = fVar60 * (fVar86 * local_33f0 + fVar45 * local_3360);
          fVar90 = fVar60 * (fVar86 * fStack_33ec + fVar45 * fStack_335c);
          fVar58 = fVar60 * (fVar86 * fStack_33e8 + fVar45 * fStack_3358);
          fVar60 = fVar60 * (fVar86 * fStack_33e4 + fVar45 * fStack_3354);
        }
        fVar45 = fVar88 * fVar45 + fVar88 * fVar45;
        fVar82 = fVar94 * -3.0;
        fVar49 = (fVar94 - fVar45) * 3.0;
        fVar59 = (fVar45 - fVar91) * 3.0;
        fVar51 = fVar51 * fVar86 + fVar51 * fVar86;
        fVar81 = fVar83 * -3.0;
        fVar45 = (fVar83 - fVar51) * 3.0;
        fVar51 = (fVar51 - fVar95) * 3.0;
        (pvVar10->field_0).v[0] =
             fVar52 * (fVar92 * (fVar82 * local_33c0.v[0] +
                                fVar49 * local_33b0.v[0] + fVar59 * local_33a0 + fVar84 * local_3390
                                ) +
                       (local_3400 * fVar82 +
                       fVar80 * fVar49 + fVar76 * fVar59 + local_33d0 * fVar84) * fVar51 +
                       (local_3440.v[0] * fVar82 +
                       fVar46 * fVar49 + fVar77 * fVar59 + local_3410 * fVar84) * fVar45 +
                      (local_3480.v[0] * fVar82 +
                      local_3470 * fVar49 + local_3460 * fVar59 + local_3450 * fVar84) * fVar81);
        (pvVar10->field_0).v[1] =
             fVar52 * (fVar92 * (fVar82 * local_33c0.v[1] +
                                fVar49 * local_33b0.v[1] +
                                fVar59 * fStack_339c + fVar84 * fStack_338c) +
                       (fStack_33fc * fVar82 +
                       fVar90 * fVar49 + fVar50 * fVar59 + fStack_33cc * fVar84) * fVar51 +
                       (local_3440.v[1] * fVar82 +
                       fVar74 * fVar49 + fVar78 * fVar59 + fStack_340c * fVar84) * fVar45 +
                      (local_3480.v[1] * fVar82 +
                      fStack_346c * fVar49 + fStack_345c * fVar59 + fStack_344c * fVar84) * fVar81);
        (pvVar10->field_0).v[2] =
             fVar52 * (fVar92 * (fVar82 * local_33c0.v[2] +
                                fVar49 * local_33b0.v[2] +
                                fVar59 * fStack_3398 + fVar84 * fStack_3388) +
                       (fStack_33f8 * fVar82 +
                       fVar58 * fVar49 + fVar48 * fVar59 + fStack_33c8 * fVar84) * fVar51 +
                       (local_3440.v[2] * fVar82 +
                       fVar75 * fVar49 + fVar79 * fVar59 + fStack_3408 * fVar84) * fVar45 +
                      (local_3480.v[2] * fVar82 +
                      fStack_3468 * fVar49 + fStack_3458 * fVar59 + fStack_3448 * fVar84) * fVar81);
        (pvVar10->field_0).v[3] =
             fVar52 * (fVar92 * (fVar82 * local_33c0.v[3] +
                                fVar49 * local_33b0.v[3] +
                                fVar59 * fStack_3394 + fVar84 * fStack_3384) +
                       (fStack_33f4 * fVar82 +
                       fVar60 * fVar49 + fVar71 * fVar59 + fStack_33c4 * fVar84) * fVar51 +
                       (local_3440.v[3] * fVar82 +
                       fVar73 * fVar49 + fVar47 * fVar59 + fStack_3404 * fVar84) * fVar45 +
                      (local_3480.v[3] * fVar82 +
                      fStack_3464 * fVar49 + fStack_3454 * fVar59 + fStack_3444 * fVar84) * fVar81);
      }
LAB_00e3253f:
      bVar24 = false;
    }
    if (!bVar24) {
      return;
    }
  } while( true );
}

Assistant:

void eval(CatmullClarkPatch& patch, Vec2f uv, float dscale, size_t depth, 
                  BezierCurve* border0 = nullptr, BezierCurve* border1 = nullptr, BezierCurve* border2 = nullptr, BezierCurve* border3 = nullptr)
        {
          while (true) 
          {
            typename CatmullClarkPatch::Type ty = patch.type();

            if (unlikely(final(patch,ty,depth)))
            {
              if (ty & CatmullClarkRing::TYPE_REGULAR) { 
                RegularPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
                PATCH_DEBUG_SUBDIVISION(234423,c,c,-1);
                return;
              } else {
                IrregularFillPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
                PATCH_DEBUG_SUBDIVISION(34534,c,-1,c);
                return;
              }
            }
            else if (ty & CatmullClarkRing::TYPE_REGULAR_CREASES) { 
              assert(depth > 0); 
              RegularPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
              PATCH_DEBUG_SUBDIVISION(43524,c,c,-1);
              return;
            }
#if PATCH_USE_GREGORY == 2
            else if (ty & CatmullClarkRing::TYPE_GREGORY_CREASES) { 
              assert(depth > 0); 
              GregoryPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
              PATCH_DEBUG_SUBDIVISION(23498,c,-1,c);
              return;
            }
#endif
            else
            {
              array_t<CatmullClarkPatch,4> patches; 
              patch.subdivide(patches); // FIXME: only have to generate one of the patches
              
              const float u = uv.x, v = uv.y;
              if (v < 0.5f) {
                if (u < 0.5f) { patch = patches[0]; uv = Vec2f(2.0f*u,2.0f*v); dscale *= 2.0f; }
                else          { patch = patches[1]; uv = Vec2f(2.0f*u-1.0f,2.0f*v); dscale *= 2.0f; }
              } else {
                if (u > 0.5f) { patch = patches[2]; uv = Vec2f(2.0f*u-1.0f,2.0f*v-1.0f); dscale *= 2.0f; }
                else          { patch = patches[3]; uv = Vec2f(2.0f*u,2.0f*v-1.0f); dscale *= 2.0f; }
              }
              depth++;
            }
          }